

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

Token * __thiscall
toml::internal::Lexer::nextStringDoubleQuote(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  bool bVar2;
  Token *pTVar3;
  int iVar4;
  char cVar5;
  bool bVar6;
  char c;
  Token *local_a8;
  allocator local_99;
  string codepoint;
  TokenType local_74;
  string local_70;
  string s;
  
  local_a8 = __return_storage_ptr__;
  bVar1 = consume(this,'\"');
  if (!bVar1) {
    std::__cxx11::string::string
              ((string *)&s,"string didn\'t start with \'\"\'",(allocator *)&codepoint);
    Token::Token(local_a8,ERROR_TOKEN,&s);
    goto LAB_0012e88a;
  }
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  bVar1 = current(this,&c);
  bVar6 = c != '\"';
  if (!bVar1 || bVar6) {
LAB_0012e5ae:
    local_74 = STRING;
LAB_0012e5c4:
    bVar2 = current(this,&c);
    if (bVar2) {
      next(this);
      cVar5 = (char)&s;
      if (c == '\"') {
        if (!bVar1 || bVar6) {
LAB_0012e8ba:
          Token::Token(local_a8,local_74,&s);
          goto LAB_0012e88a;
        }
        bVar2 = current(this,&c);
        if (bVar2 && c == '\"') {
          next(this);
          bVar2 = current(this,&c);
          if (bVar2 && c == '\"') {
            next(this);
            local_74 = MULTILINE_STRING;
            goto LAB_0012e8ba;
          }
          std::__cxx11::string::push_back(cVar5);
        }
      }
      else if (c == '\\') {
        bVar2 = current(this,&c);
        if (!bVar2) {
          std::__cxx11::string::string
                    ((string *)&codepoint,"string has unknown escape sequence",
                     (allocator *)&local_70);
          Token::Token(local_a8,ERROR_TOKEN,&codepoint);
          goto LAB_0012e880;
        }
        next(this);
        if ((byte)c - 0x6e < 8) {
          pTVar3 = (Token *)(*(code *)(&DAT_001630cc +
                                      *(int *)(&DAT_001630cc + (ulong)((byte)c - 0x6e) * 4)))();
          return pTVar3;
        }
        if (c == '\\') {
          c = '\\';
        }
        else if (c == '\"') {
          c = '\"';
        }
        else {
          if (c != '\'') {
            if (c == 'U') {
              iVar4 = 8;
              codepoint._M_dataplus._M_p = (pointer)&codepoint.field_2;
              codepoint._M_string_length = 0;
              codepoint.field_2._M_local_buf[0] = '\0';
              while (bVar2 = iVar4 != 0, iVar4 = iVar4 + -1, bVar2) {
                bVar2 = current(this,&c);
                if ((!bVar2) ||
                   ((9 < (byte)(c - 0x30U) &&
                    ((0x25 < (byte)c - 0x41 ||
                     ((0x3f0000003fU >> ((ulong)((byte)c - 0x41) & 0x3f) & 1) == 0)))))) {
                  std::__cxx11::string::string
                            ((string *)&local_70,"string has unknown escape sequence",&local_99);
                  Token::Token(local_a8,ERROR_TOKEN,&local_70);
                  std::__cxx11::string::~string((string *)&local_70);
                  goto LAB_0012e880;
                }
                std::__cxx11::string::push_back((char)&codepoint);
                next(this);
              }
              unescape(&local_70,&codepoint);
              std::__cxx11::string::append((string *)&s);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&codepoint);
            }
            else {
              if (c != '\n') {
                std::__cxx11::string::string
                          ((string *)&codepoint,"string has unknown escape sequence",
                           (allocator *)&local_70);
                Token::Token(local_a8,ERROR_TOKEN,&codepoint);
                goto LAB_0012e880;
              }
              while( true ) {
                bVar2 = current(this,&c);
                if (((!bVar2) || (0x20 < (ulong)(byte)c)) ||
                   ((0x100002600U >> ((ulong)(byte)c & 0x3f) & 1) == 0)) break;
                next(this);
              }
            }
            goto LAB_0012e5c4;
          }
          c = '\'';
        }
      }
      std::__cxx11::string::push_back(cVar5);
      goto LAB_0012e5c4;
    }
    std::__cxx11::string::string((string *)&codepoint,"string didn\'t end",(allocator *)&local_70);
    Token::Token(local_a8,ERROR_TOKEN,&codepoint);
  }
  else {
    next(this);
    bVar2 = current(this,&c);
    if (bVar2 && c == '\"') {
      next(this);
      while( true ) {
        bVar2 = current(this,&c);
        if ((!bVar2) || ((c != ' ' && (c != '\t')))) break;
        next(this);
      }
      bVar2 = current(this,&c);
      if (bVar2 && c == '\n') {
        next(this);
      }
      goto LAB_0012e5ae;
    }
    codepoint._M_dataplus._M_p = (pointer)&codepoint.field_2;
    codepoint._M_string_length = 0;
    codepoint.field_2._M_local_buf[0] = '\0';
    Token::Token(local_a8,STRING,&codepoint);
  }
LAB_0012e880:
  std::__cxx11::string::~string((string *)&codepoint);
LAB_0012e88a:
  std::__cxx11::string::~string((string *)&s);
  return local_a8;
}

Assistant:

inline Token Lexer::nextStringDoubleQuote()
{
    if (!consume('"'))
        return Token(TokenType::ERROR_TOKEN, std::string("string didn't start with '\"'"));

    std::string s;
    char c;
    bool multiline = false;

    if (current(&c) && c == '"') {
        next();
        if (!current(&c) || c != '"') {
            // OK. It's empty string.
            return Token(TokenType::STRING, std::string());
        }

        next();
        // raw string literal started.
        // Newline just after """ should be ignored.
        while (current(&c) && (c == ' ' || c == '\t'))
            next();
        if (current(&c) && c == '\n')
            next();
        multiline = true;
    }

    while (current(&c)) {
        next();
        if (c == '\\') {
            if (!current(&c))
                return Token(TokenType::ERROR_TOKEN, std::string("string has unknown escape sequence"));
            next();
            switch (c) {
            case 't': c = '\t'; break;
            case 'n': c = '\n'; break;
            case 'r': c = '\r'; break;
            case 'u':
            case 'U': {
                int size = c == 'u' ? 4 : 8;
                std::string codepoint;
                for (int i = 0; i < size; ++i) {
                  if (current(&c) && (('0' <= c && c <= '9') || ('A' <= c && c <= 'F') || ('a' <= c && c <= 'f'))) {
                    codepoint += c;
                    next();
                  } else {
                    return Token(TokenType::ERROR_TOKEN, std::string("string has unknown escape sequence"));
                  }
                }
                s += unescape(codepoint);
                continue;
            }
            case '"': c = '"'; break;
            case '\'': c = '\''; break;
            case '\\': c = '\\'; break;
            case '\n':
                while (current(&c) && (c == ' ' || c == '\t' || c == '\r' || c == '\n')) {
                    next();
                }
                continue;
            default:
                return Token(TokenType::ERROR_TOKEN, std::string("string has unknown escape sequence"));
            }
        } else if (c == '"') {
            if (multiline) {
                if (current(&c) && c == '"') {
                    next();
                    if (current(&c) && c == '"') {
                        next();
                        return Token(TokenType::MULTILINE_STRING, s);
                    } else {
                        s += '"';
                        s += '"';
                        continue;
                    }
                } else {
                    s += '"';
                    continue;
                }
            } else {
                return Token(TokenType::STRING, s);
            }
        }

        s += c;
    }

    return Token(TokenType::ERROR_TOKEN, std::string("string didn't end"));
}